

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

int check24(aint val)

{
  bool bVar1;
  char buffer [64];
  
  bVar1 = 0xfdffffff < val - 0x1000000U;
  if (!bVar1) {
    snprintf(buffer,0x40,"value 0x%X is truncated to 24bit value: 0x%06X",val,
             (ulong)(val & 0xffffff));
    Warning(buffer,(char *)0x0,W_PASS3);
  }
  return (uint)bVar1;
}

Assistant:

int check24(aint val) {
	if (val < -16777216 || val > 16777215) {
		char buffer[64];
		SPRINTF2(buffer, 64, "value 0x%X is truncated to 24bit value: 0x%06X", val, val&0xFFFFFF);
		Warning(buffer);
		return 0;
	}
	return 1;
}